

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::broadcastTransaction
          (ChainImpl *this,CTransactionRef *tx,CAmount *max_tx_fee,bool relay,string *err_string)

{
  NodeContext *node;
  TransactionError TVar1;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  undefined1 in_stack_ffffffffffffffb8;
  pointer local_30;
  
  local_30 = *(pointer *)(in_FS_OFFSET + 0x28);
  node = this->m_node;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffc0,
             &tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)err_string;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xffffffffffffffc0;
  TVar1 = BroadcastTransaction
                    (node,tx_00,(string *)max_tx_fee,
                     (CAmount *)(CONCAT71(in_register_00000009,relay) & 0xffffffff),false,
                     (bool)in_stack_ffffffffffffffb8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_30) {
    return TVar1 == OK;
  }
  __stack_chk_fail();
}

Assistant:

bool broadcastTransaction(const CTransactionRef& tx,
        const CAmount& max_tx_fee,
        bool relay,
        std::string& err_string) override
    {
        const TransactionError err = BroadcastTransaction(m_node, tx, err_string, max_tx_fee, relay, /*wait_callback=*/false);
        // Chain clients only care about failures to accept the tx to the mempool. Disregard non-mempool related failures.
        // Note: this will need to be updated if BroadcastTransactions() is updated to return other non-mempool failures
        // that Chain clients do not need to know about.
        return TransactionError::OK == err;
    }